

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamZ.cpp
# Opt level: O0

void __thiscall OpenMD::TetrahedralityParamZ::writeQz(TetrahedralityParamZ *this)

{
  bool bVar1;
  byte bVar2;
  reference pdVar3;
  size_type sVar4;
  char *pcVar5;
  ostream *poVar6;
  reference pvVar7;
  reference pvVar8;
  undefined8 uVar9;
  long in_RDI;
  double dVar10;
  double dVar11;
  double dVar12;
  __type _Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  RealType e95;
  RealType stdDev;
  RealType mean;
  RealType z;
  uint i;
  ofstream qZstream;
  RealType zAve;
  iterator j;
  RealType zSum;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffcc0;
  errorStruct *peVar16;
  uint local_238;
  ostream local_228 [512];
  double local_28;
  double *local_20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_18;
  double local_10;
  
  local_10 = 0.0;
  local_18._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcb8);
  while( true ) {
    local_20 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffcb8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffcc0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffcb8);
    local_28 = local_10;
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_18);
    local_10 = *pdVar3 + local_10;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_18);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd50));
  auVar14._8_4_ = (int)(sVar4 >> 0x20);
  auVar14._0_8_ = sVar4;
  auVar14._12_4_ = 0x45300000;
  local_28 = local_28 /
             ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_228,pcVar5,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    uVar9 = std::__cxx11::string::c_str();
    peVar16 = &painCave;
    snprintf(painCave.errMsg,2000,"TetrahedralityParamZ: unable to open %s\n",uVar9);
    peVar16->isFatal = 1;
    simError();
  }
  else {
    poVar6 = std::operator<<(local_228,"#Tetrahedrality Parameters (");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0xdb8));
    std::operator<<(poVar6,")\n");
    poVar6 = std::operator<<(local_228,"#nFrames:\t");
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd50));
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar4);
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(local_228,"#selection 1: (");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0xd0));
    std::operator<<(poVar6,")\n");
    poVar6 = std::operator<<(local_228,"#selection 2: (");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0xf0));
    std::operator<<(poVar6,")\n");
    poVar6 = std::operator<<(local_228,"#");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 0xdb8));
    std::operator<<(poVar6,"\tQk\n");
    for (local_238 = 0;
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd68)),
        local_238 < sVar4; local_238 = local_238 + 1) {
      dVar10 = local_28 * ((double)local_238 + 0.5);
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd68));
      auVar15._8_4_ = (int)(sVar4 >> 0x20);
      auVar15._0_8_ = sVar4;
      auVar15._12_4_ = 0x45300000;
      dVar10 = dVar10 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd98),(ulong)local_238);
      if (*pvVar7 != 0) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd68),
                            (ulong)local_238);
        dVar11 = *pvVar8;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd98),(ulong)local_238);
        dVar11 = dVar11 / (double)*pvVar7;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd80),
                            (ulong)local_238);
        dVar12 = *pvVar8;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd98),(ulong)local_238);
        dVar12 = sqrt(-dVar11 * dVar11 + dVar12 / (double)*pvVar7);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd98),(ulong)local_238);
        if (*pvVar7 == 1) {
          poVar6 = (ostream *)std::ostream::operator<<(local_228,dVar10);
          poVar6 = std::operator<<(poVar6,"\t");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar11);
          std::operator<<(poVar6,"\n");
        }
        else {
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd98),(ulong)local_238);
          _Var13 = std::sqrt<int>(0);
          poVar6 = (ostream *)std::ostream::operator<<(local_228,dVar10);
          poVar6 = std::operator<<(poVar6,"\t");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar11);
          poVar6 = std::operator<<(poVar6,"\t");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(dVar12 * 1.96) / _Var13);
          std::operator<<(poVar6,"\n");
        }
      }
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void TetrahedralityParamZ::writeQz() {
    // compute average box length:

    RealType zSum = 0.0;
    for (std::vector<RealType>::iterator j = zBox_.begin(); j != zBox_.end();
         ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    std::ofstream qZstream(outputFilename_.c_str());
    if (qZstream.is_open()) {
      qZstream << "#Tetrahedrality Parameters (" << axisLabel_ << ")\n";

      qZstream << "#nFrames:\t" << zBox_.size() << "\n";
      qZstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qZstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qZstream << "#" << axisLabel_ << "\tQk\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / sliceQ_.size();
        if (sliceCount_[i] != 0) {
          RealType mean   = sliceQ_[i] / sliceCount_[i];
          RealType stdDev = sqrt(sliceQ2_[i] / sliceCount_[i] - mean * mean);
          if (sliceCount_[i] == 1) {
            qZstream << z << "\t" << mean << "\n";
          } else {
            RealType e95 = 1.96 * stdDev / sqrt(sliceCount_[i] - 1);
            qZstream << z << "\t" << mean << "\t" << e95 << "\n";
          }
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TetrahedralityParamZ: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qZstream.close();
  }